

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::attach(form *this,base_widget *subform)

{
  base_widget *in_RSI;
  vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  *in_RDI;
  value_type *__x;
  bool local_21;
  pair<cppcms::base_form_*,_bool> local_20;
  base_widget *local_10 [2];
  
  __x = (value_type *)
        &(in_RDI->
         super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  local_21 = true;
  local_10[0] = in_RSI;
  std::pair<cppcms::base_form_*,_bool>::pair<cppcms::widgets::base_widget_*&,_bool,_true>
            (&local_20,local_10,&local_21);
  std::
  vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
  ::push_back(in_RDI,__x);
  (*(local_10[0]->super_base_form)._vptr_base_form[4])(local_10[0],in_RDI);
  return;
}

Assistant:

void form::attach(widgets::base_widget *subform)
{
	elements_.push_back(widget_type(subform,true));
	subform->parent(this);
}